

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# identifier.c
# Opt level: O0

int mpt_identifier_compare(mpt_identifier *id,char *name,int nlen)

{
  size_t sVar1;
  int local_34;
  char *pcStack_30;
  int i;
  char *base;
  int nlen_local;
  char *name_local;
  mpt_identifier *id_local;
  
  pcStack_30 = id->_val;
  if ((name == (char *)0x0) || (id->_charset == '\x01')) {
    base._4_4_ = nlen;
    if (nlen < 0) {
      if (name == (char *)0x0) {
        return -1;
      }
      sVar1 = strlen(name);
      base._4_4_ = (int)sVar1;
    }
    if ((base._4_4_ == 0) && (id->_len == 0)) {
      id_local._4_4_ = 0;
    }
    else if (base._4_4_ + 1U == (uint)id->_len) {
      if ((ushort)id->_max < id->_len) {
        pcStack_30 = id->_base;
      }
      if (name == (char *)0x0) {
        for (local_34 = 0; local_34 <= base._4_4_; local_34 = local_34 + 1) {
          if (pcStack_30[local_34] != '\0') {
            return local_34 + 1;
          }
        }
        id_local._4_4_ = 0;
      }
      else {
        for (local_34 = 0; local_34 < base._4_4_; local_34 = local_34 + 1) {
          if (pcStack_30[local_34] != name[local_34]) {
            return local_34 + 1;
          }
        }
        if (pcStack_30[base._4_4_] == '\0') {
          id_local._4_4_ = 0;
        }
        else {
          id_local._4_4_ = base._4_4_;
        }
      }
    }
    else {
      id_local._4_4_ = -0x10;
    }
  }
  else {
    id_local._4_4_ = -3;
  }
  return id_local._4_4_;
}

Assistant:

extern int mpt_identifier_compare(const MPT_STRUCT(identifier) *id, const char *name, int nlen)
{
	const char *base = id->_val;
	int i;
	
	if (name && (id->_charset != MPT_CHARSET(UTF8))) {
		return MPT_ERROR(BadType);
	}
	if (nlen < 0) {
		if (!name) {
			return MPT_ERROR(BadArgument);
		}
		nlen = strlen(name);
	}
	if (!nlen && !id->_len) {
		return 0;
	}
	if ((nlen + 1) != id->_len) {
		return MPT_ERROR(MissingData);
	}
	if (id->_len > id->_max) {
		base = id->_base;
	}
	if (!name) {
		for (i = 0; i <= nlen; ++i) {
			if (base[i]) {
				return i + 1;
			}
		}
		return 0;
	}
	for (i = 0; i < nlen; ++i) {
		if (base[i] != name[i]) {
			return i + 1;
		}
	}
	if (base[nlen]) {
		return nlen;
	}
	return 0;
}